

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

int32_t lj_lib_checkintrange(lua_State *L,int narg,int32_t a,int32_t b)

{
  long lVar1;
  int iVar2;
  TValue *pTVar3;
  ulong uVar4;
  uint64_t i_2;
  int64_t i_1;
  GCcdata *cd;
  int32_t i;
  TValue *o;
  int32_t b_local;
  int32_t a_local;
  int narg_local;
  lua_State *L_local;
  
  pTVar3 = L->base + (long)narg + -1;
  if (L->top <= pTVar3) {
LAB_001278b7:
    lj_err_argt(L,narg,3);
  }
  if ((uint)((int)(pTVar3->field_4).it >> 0xf) < 0xfffffff2) {
    iVar2 = (int)pTVar3->n;
    if ((a <= iVar2) && (iVar2 <= b)) {
      return iVar2;
    }
  }
  else {
    if ((int)(pTVar3->field_4).it >> 0xf != -0xb) goto LAB_001278b7;
    uVar4 = pTVar3->u64 & 0x7fffffffffff;
    if (*(short *)(uVar4 + 10) == 0xb) {
      lVar1 = *(long *)(uVar4 + 0x10);
      if ((a <= lVar1) && (lVar1 <= b)) {
        return (int32_t)lVar1;
      }
    }
    else {
      if (*(short *)(uVar4 + 10) != 0xc) goto LAB_001278b7;
      uVar4 = *(ulong *)(uVar4 + 0x10);
      if (((a < 0) || ((ulong)(long)a <= uVar4)) && (uVar4 <= (ulong)(long)b)) {
        return (int32_t)uVar4;
      }
    }
  }
  lj_err_arg(L,narg,LJ_ERR_NUMRNG);
}

Assistant:

int32_t lj_lib_checkintrange(lua_State *L, int narg, int32_t a, int32_t b)
{
  TValue *o = L->base + narg-1;
  lj_assertL(b >= 0, "expected range must be non-negative");
  if (o < L->top) {
    if (LJ_LIKELY(tvisint(o))) {
      int32_t i = intV(o);
      if (i >= a && i <= b) return i;
    } else if (LJ_LIKELY(tvisnum(o))) {
      /* For performance reasons, this doesn't check for integerness or
      ** integer overflow. Overflow detection still works, since all FPUs
      ** return either MININT or MAXINT, which is then out of range.
      */
      int32_t i = (int32_t)numV(o);
      if (i >= a && i <= b) return i;
#if LJ_HASFFI
    } else if (tviscdata(o)) {
      GCcdata *cd = cdataV(o);
      if (cd->ctypeid == CTID_INT64) {
	int64_t i = *(int64_t *)cdataptr(cd);
	if (i >= (int64_t)a && i <= (int64_t)b) return (int32_t)i;
      } else if (cd->ctypeid == CTID_UINT64) {
	uint64_t i = *(uint64_t *)cdataptr(cd);
	if ((a < 0 || i >= (uint64_t)a) && i <= (uint64_t)b) return (int32_t)i;
      } else {
	goto badtype;
      }
#endif
    } else {
      goto badtype;
    }
    lj_err_arg(L, narg, LJ_ERR_NUMRNG);
  }
badtype:
  lj_err_argt(L, narg, LUA_TNUMBER);
  return 0;  /* unreachable */
}